

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O3

int compare_timer_contexts(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (bv <= av) {
    uVar1 = (uint)(bv < av);
  }
  return uVar1;
}

Assistant:

static int compare_timer_contexts(void *av, void *bv)
{
    char *a = (char *)av;
    char *b = (char *)bv;
    if (a < b)
        return -1;
    else if (a > b)
        return +1;
    return 0;
}